

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O2

positionTy * __thiscall
DataRefs::GetUsersPlanePos
          (positionTy *__return_storage_ptr__,DataRefs *this,double *pTrueAirspeed_m,double *pTrack,
          double *pHeightAGL_m)

{
  long lVar1;
  positionTy *ppVar2;
  positionTy *ppVar3;
  byte bVar4;
  
  bVar4 = 0;
  std::recursive_mutex::lock(&mutexDrUpdate);
  ppVar2 = &this->lastUsersPlanePos;
  ppVar3 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    ppVar3->_lat = ppVar2->_lat;
    ppVar2 = (positionTy *)((long)ppVar2 + (ulong)bVar4 * -0x10 + 8);
    ppVar3 = (positionTy *)((long)ppVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  if (pTrueAirspeed_m != (double *)0x0) {
    *pTrueAirspeed_m = this->lastUsersTrueAirspeed;
  }
  if (pTrack != (double *)0x0) {
    *pTrack = this->lastUsersTrack;
  }
  if (pHeightAGL_m != (double *)0x0) {
    *pHeightAGL_m = (double)this->lastUsersAGL_ft * 0.3048;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&mutexDrUpdate);
  return __return_storage_ptr__;
}

Assistant:

positionTy DataRefs::GetUsersPlanePos(double* pTrueAirspeed_m,
                                      double* pTrack,
                                      double* pHeightAGL_m) const
{
    // access guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(mutexDrUpdate);

    // Copy the values
    positionTy ret = lastUsersPlanePos;
    if (pTrueAirspeed_m)    *pTrueAirspeed_m    = lastUsersTrueAirspeed;
    if (pTrack)             *pTrack             = lastUsersTrack;
    if (pHeightAGL_m)       *pHeightAGL_m       = lastUsersAGL_ft * M_per_FT;

    return ret;
}